

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::LineRenderTestCase::init
          (LineRenderTestCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  LineRenderTestCase *this_local;
  
  pRVar2 = gles3::Context::getRenderContext((this->super_RenderTestCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  checkLineWidth((Functions *)CONCAT44(extraout_var,iVar1),this->m_lineWidth);
  return extraout_EAX;
}

Assistant:

void LineRenderTestCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	checkLineWidth (gl, m_lineWidth);
}